

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_generic_fp-inl.h
# Opt level: O0

bool anon_unknown.dwarf_397f::stacktrace_generic_fp::CheckPageIsReadable
               (void *ptr,void *checked_ptr)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uintptr_t parent_frame;
  uintptr_t addr;
  void *checked_ptr_local;
  void *ptr_local;
  
  if (CheckPageIsReadable::pagesize == 0) {
    iVar2 = getpagesize();
    CheckPageIsReadable::pagesize = (uintptr_t)iVar2;
  }
  uVar3 = (CheckPageIsReadable::pagesize - 1 ^ 0xffffffffffffffff) & (ulong)checked_ptr;
  uVar4 = (CheckPageIsReadable::pagesize - 1 ^ 0xffffffffffffffff) & (ulong)ptr;
  if ((uVar3 == 0) || (uVar4 != uVar3)) {
    bVar1 = (*(code *)(anonymous_namespace)::CheckAddress)
                      (uVar4,CheckPageIsReadable::pagesize & 0xffffffff);
    ptr_local._7_1_ = (bool)(bVar1 & 1);
  }
  else {
    ptr_local._7_1_ = true;
  }
  return ptr_local._7_1_;
}

Assistant:

bool CheckPageIsReadable(void* ptr, void* checked_ptr) {
  static uintptr_t pagesize;
  if (pagesize == 0) {
    pagesize = getpagesize();
  }

  uintptr_t addr = reinterpret_cast<uintptr_t>(ptr);
  uintptr_t parent_frame = reinterpret_cast<uintptr_t>(checked_ptr);

  parent_frame &= ~(pagesize - 1);
  addr &= ~(pagesize - 1);

  if (parent_frame != 0 && addr == parent_frame) {
    return true;
  }

  return CheckAddress(addr, pagesize);
}